

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O1

bool __thiscall mp::NLSolver::LoadModel(NLSolver *this,NLModel *mdl)

{
  NLHeader *pNVar1;
  bool bVar2;
  NLHeader *__dest;
  NLFeeder_Easy nlf;
  NLFeeder_Easy NStack_2d8;
  
  NLFeeder_Easy::NLFeeder_Easy(&NStack_2d8,mdl,this->nl_opts_);
  NLFeeder_Easy::ExportPreproData(&NStack_2d8,&this->pd_);
  __dest = (NLHeader *)operator_new(0x110);
  memcpy(__dest,&NStack_2d8.header_,0x110);
  pNVar1 = (this->p_nlheader_)._M_t.
           super___uniq_ptr_impl<mp::NLHeader,_std::default_delete<mp::NLHeader>_>._M_t.
           super__Tuple_impl<0UL,_mp::NLHeader_*,_std::default_delete<mp::NLHeader>_>.
           super__Head_base<0UL,_mp::NLHeader_*,_false>._M_head_impl;
  (this->p_nlheader_)._M_t.super___uniq_ptr_impl<mp::NLHeader,_std::default_delete<mp::NLHeader>_>.
  _M_t.super__Tuple_impl<0UL,_mp::NLHeader_*,_std::default_delete<mp::NLHeader>_>.
  super__Head_base<0UL,_mp::NLHeader_*,_false>._M_head_impl = __dest;
  if (pNVar1 != (NLHeader *)0x0) {
    operator_delete(pNVar1,0x110);
  }
  bVar2 = LoadModel<mp::NLFeeder_Easy>(this,&NStack_2d8);
  if (NStack_2d8.col_sizes_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(NStack_2d8.col_sizes_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)NStack_2d8.col_sizes_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)NStack_2d8.col_sizes_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (NStack_2d8.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(NStack_2d8.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)NStack_2d8.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)NStack_2d8.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    NStack_2d8.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    NStack_2d8.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    NStack_2d8.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    NStack_2d8.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    NStack_2d8.obj_grad_supp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (NStack_2d8.var_perm_.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(NStack_2d8.var_perm_.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)NStack_2d8.var_perm_.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)NStack_2d8.var_perm_.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (NStack_2d8.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(NStack_2d8.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)NStack_2d8.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)NStack_2d8.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    NStack_2d8.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    NStack_2d8.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    NStack_2d8.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    NStack_2d8.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    NStack_2d8.nlv_obj_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
  ::~_Rb_tree((_Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
               *)&NStack_2d8.nlme_.suffixes_);
  return bVar2;
}

Assistant:

bool NLSolver::LoadModel(const NLModel& mdl) {
  NLFeeder_Easy nlf(mdl, nl_opts_);
  nlf.ExportPreproData(pd_);
  p_nlheader_.reset(new NLHeader(nlf.Header()));
  return LoadModel(nlf);
}